

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O0

string * MakeAbsolutePath_abi_cxx11_(string *__return_storage_ptr__,char *in)

{
  char *__s;
  Logger *this;
  basic_formatter *this_00;
  allocator<char> local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_58;
  char *local_28;
  char *ret;
  char *local_18;
  char *in_local;
  string *out;
  
  ret._7_1_ = 0;
  local_18 = in;
  in_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = realpath(local_18,(char *)0x0);
  if (local_28 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_28);
    free(local_28);
  }
  if (local_28 == (char *)0x0) {
    this = Assimp::DefaultLogger::get();
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[15]>(&local_1d0,(char (*) [15])"Invalid path: ");
    __s = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,__s,&local_1f1);
    this_00 = (basic_formatter *)
              Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1d0,&local_1f0);
    Assimp::Formatter::basic_formatter::operator_cast_to_string(&local_58,this_00);
    Assimp::Logger::warn(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1d0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static std::string MakeAbsolutePath(const char* in)
{
    ai_assert(in);
    std::string out;
#ifdef _WIN32
    wchar_t* ret = ::_wfullpath(nullptr, Utf8ToWide(in).c_str(), 0);
    if (ret) {
        out = WideToUtf8(ret);
        free(ret);
    }
#else
    char* ret = realpath(in, nullptr);
    if (ret) {
        out = ret;
        free(ret);
    }
#endif
    if (!ret) {
        // preserve the input path, maybe someone else is able to fix
        // the path before it is accessed (e.g. our file system filter)
        ASSIMP_LOG_WARN_F("Invalid path: ", std::string(in));
        out = in;
    }
    return out;
}